

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O3

string * __thiscall
cmLocalNinjaGenerator::CreateUtilityOutput
          (string *__return_storage_ptr__,cmLocalNinjaGenerator *this,string *targetName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *byproducts,cmListFileBacktrace *bt)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  cmSourceFile *this_00;
  pointer pbVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string base;
  string force;
  string local_e8;
  size_type local_c8;
  pointer local_c0;
  undefined8 local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  string local_a8;
  string *local_88;
  string *local_80;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  string local_60;
  
  iVar2 = (*((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator)->
            _vptr_cmGlobalGenerator[0x26])();
  if (((char)iVar2 == '\0') || (bVar1 = HasUniqueByproducts(this,byproducts,bt), !bVar1)) {
    cmLocalGenerator::CreateUtilityOutput
              (__return_storage_ptr__,(cmLocalGenerator *)this,targetName,byproducts,bt);
  }
  else {
    local_88 = __return_storage_ptr__;
    psVar3 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
    local_e8._M_string_length = (size_type)(psVar3->_M_dataplus)._M_p;
    local_e8._M_dataplus._M_p = (pointer)psVar3->_M_string_length;
    local_e8.field_2._M_allocated_capacity = 0xc;
    local_e8.field_2._8_8_ = (long)"**/CMakeFiles/" + 2;
    local_c0 = (targetName->_M_dataplus)._M_p;
    local_c8 = targetName->_M_string_length;
    local_b0 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)0x1;
    local_60.field_2._M_local_buf[0] = '-';
    local_b8 = 1;
    views._M_len = 4;
    views._M_array = (iterator)&local_e8;
    local_80 = targetName;
    local_60._M_string_length = (size_type)local_b0;
    cmCatViews_abi_cxx11_(&local_a8,views);
    cmMakefile::GetGeneratorConfigs_abi_cxx11_
              (&local_78,(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,
               IncludeEmptyConfig);
    if (local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_78.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar4 = local_78.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        local_e8.field_2._8_8_ = (pbVar4->_M_dataplus)._M_p;
        local_e8.field_2._M_allocated_capacity = pbVar4->_M_string_length;
        local_e8._M_dataplus._M_p = (pointer)local_a8._M_string_length;
        local_e8._M_string_length = (size_type)local_a8._M_dataplus._M_p;
        views_00._M_len = 2;
        views_00._M_array = (iterator)&local_e8;
        cmCatViews_abi_cxx11_(&local_60,views_00);
        this_00 = cmMakefile::GetOrCreateGeneratedSource
                            ((this->super_cmLocalCommonGenerator).super_cmLocalGenerator.Makefile,
                             &local_60);
        if (this_00 == (cmSourceFile *)0x0) {
          std::operator+(&local_e8,"Could not get source file entry for ",&local_60);
          cmSystemTools::Error(&local_e8);
        }
        else {
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"SYMBOLIC","");
          cmSourceFile::SetProperty(this_00,&local_e8,"1");
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p != &local_60.field_2) {
          operator_delete(local_60._M_dataplus._M_p,
                          CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                                   local_60.field_2._M_local_buf[0]) + 1);
        }
        pbVar4 = pbVar4 + 1;
      } while (pbVar4 != local_78.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.GlobalGenerator[1].
                   TargetSearchIndex,local_80);
    __return_storage_ptr__ = local_88;
    local_e8._M_dataplus._M_p = (pointer)local_a8._M_string_length;
    local_e8._M_string_length = (size_type)local_a8._M_dataplus._M_p;
    local_e8.field_2._M_allocated_capacity = 9;
    local_e8.field_2._8_8_ = (long)"_$<CONFIG>" + 1;
    views_01._M_len = 2;
    views_01._M_array = (iterator)&local_e8;
    cmCatViews_abi_cxx11_(local_88,views_01);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmLocalNinjaGenerator::CreateUtilityOutput(
  std::string const& targetName, std::vector<std::string> const& byproducts,
  cmListFileBacktrace const& bt)
{
  // In Ninja Multi-Config, we can only produce cross-config utility
  // commands if all byproducts are per-config.
  if (!this->GetGlobalGenerator()->IsMultiConfig() ||
      !this->HasUniqueByproducts(byproducts, bt)) {
    return this->cmLocalGenerator::CreateUtilityOutput(targetName, byproducts,
                                                       bt);
  }

  std::string const base = cmStrCat(this->GetCurrentBinaryDirectory(),
                                    "/CMakeFiles/", targetName, '-');
  // The output is not actually created so mark it symbolic.
  for (std::string const& config :
       this->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig)) {
    std::string const force = cmStrCat(base, config);
    if (cmSourceFile* sf = this->Makefile->GetOrCreateGeneratedSource(force)) {
      sf->SetProperty("SYMBOLIC", "1");
    } else {
      cmSystemTools::Error("Could not get source file entry for " + force);
    }
  }
  this->GetGlobalNinjaGenerator()->AddPerConfigUtilityTarget(targetName);
  return cmStrCat(base, "$<CONFIG>"_s);
}